

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qevent.cpp
# Opt level: O1

void formatInputMethodEvent(QDebug *d,QInputMethodEvent *e)

{
  Stream *pSVar1;
  long lVar2;
  long in_FS_OFFSET;
  QByteArrayView QVar3;
  QByteArrayView QVar4;
  QByteArrayView QVar5;
  QByteArrayView QVar6;
  QByteArrayView QVar7;
  QByteArrayView QVar8;
  undefined1 local_98 [16];
  undefined1 local_88 [16];
  anon_union_24_3_e3d07ef4_for_data local_78;
  QDebug local_58;
  QDebug local_50;
  QString local_48;
  long local_30;
  
  local_30 = *(long *)(in_FS_OFFSET + 0x28);
  pSVar1 = d->stream;
  QVar3.m_data = (storage_type *)0x12;
  QVar3.m_size = (qsizetype)&local_48;
  QString::fromUtf8(QVar3);
  QTextStream::operator<<(&pSVar1->ts,&local_48);
  if (&(local_48.d.d)->super_QArrayData != (QArrayData *)0x0) {
    LOCK();
    ((local_48.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
         ((local_48.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
    UNLOCK();
    if (((local_48.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
      QArrayData::deallocate(&(local_48.d.d)->super_QArrayData,2,0x10);
    }
  }
  if (d->stream->space == true) {
    QTextStream::operator<<(&d->stream->ts,' ');
  }
  if ((e->m_preedit).d.size != 0) {
    pSVar1 = d->stream;
    QVar4.m_data = (storage_type *)0x8;
    QVar4.m_size = (qsizetype)&local_48;
    QString::fromUtf8(QVar4);
    QTextStream::operator<<(&pSVar1->ts,&local_48);
    if (&(local_48.d.d)->super_QArrayData != (QArrayData *)0x0) {
      LOCK();
      ((local_48.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
           ((local_48.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
      UNLOCK();
      if (((local_48.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
        QArrayData::deallocate(&(local_48.d.d)->super_QArrayData,2,0x10);
      }
    }
    if (d->stream->space == true) {
      QTextStream::operator<<(&d->stream->ts,' ');
    }
    local_50 = (QDebug)d->stream;
    (local_50.stream)->ref = (local_50.stream)->ref + 1;
    formatUnicodeString(&local_50,&e->m_preedit);
    QDebug::~QDebug(&local_50);
  }
  if ((e->m_commit).d.size != 0) {
    pSVar1 = d->stream;
    QVar5.m_data = (storage_type *)0x9;
    QVar5.m_size = (qsizetype)&local_48;
    QString::fromUtf8(QVar5);
    QTextStream::operator<<(&pSVar1->ts,&local_48);
    if (&(local_48.d.d)->super_QArrayData != (QArrayData *)0x0) {
      LOCK();
      ((local_48.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
           ((local_48.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
      UNLOCK();
      if (((local_48.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
        QArrayData::deallocate(&(local_48.d.d)->super_QArrayData,2,0x10);
      }
    }
    if (d->stream->space == true) {
      QTextStream::operator<<(&d->stream->ts,' ');
    }
    local_58 = (QDebug)d->stream;
    (local_58.stream)->ref = (local_58.stream)->ref + 1;
    formatUnicodeString(&local_58,&e->m_commit);
    QDebug::~QDebug(&local_58);
  }
  if (e->m_replacementLength != 0) {
    pSVar1 = d->stream;
    QVar6.m_data = (storage_type *)0x13;
    QVar6.m_size = (qsizetype)&local_48;
    QString::fromUtf8(QVar6);
    QTextStream::operator<<(&pSVar1->ts,&local_48);
    if (&(local_48.d.d)->super_QArrayData != (QArrayData *)0x0) {
      LOCK();
      ((local_48.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
           ((local_48.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
      UNLOCK();
      if (((local_48.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
        QArrayData::deallocate(&(local_48.d.d)->super_QArrayData,2,0x10);
      }
    }
    if (d->stream->space == true) {
      QTextStream::operator<<(&d->stream->ts,' ');
    }
    QTextStream::operator<<(&d->stream->ts,e->m_replacementStart);
    if (d->stream->space == true) {
      QTextStream::operator<<(&d->stream->ts,' ');
    }
    pSVar1 = d->stream;
    QVar7.m_data = (storage_type *)0x14;
    QVar7.m_size = (qsizetype)&local_48;
    QString::fromUtf8(QVar7);
    QTextStream::operator<<(&pSVar1->ts,&local_48);
    if (&(local_48.d.d)->super_QArrayData != (QArrayData *)0x0) {
      LOCK();
      ((local_48.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
           ((local_48.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
      UNLOCK();
      if (((local_48.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
        QArrayData::deallocate(&(local_48.d.d)->super_QArrayData,2,0x10);
      }
    }
    if (d->stream->space == true) {
      QTextStream::operator<<(&d->stream->ts,' ');
    }
    QTextStream::operator<<(&d->stream->ts,e->m_replacementLength);
    if (d->stream->space == true) {
      QTextStream::operator<<(&d->stream->ts,' ');
    }
  }
  local_78.shared = (PrivateShared *)(e->m_attributes).d.d;
  local_78._8_8_ = (e->m_attributes).d.ptr;
  lVar2 = (e->m_attributes).d.size;
  if (local_78.shared != (PrivateShared *)0x0) {
    LOCK();
    *(int *)local_78.shared = *(int *)local_78.shared + 1;
    UNLOCK();
  }
  local_78._16_8_ = lVar2;
  if (lVar2 != 0) {
    pSVar1 = d->stream;
    QVar8.m_data = (storage_type *)0xf;
    QVar8.m_size = (qsizetype)&local_48;
    QString::fromUtf8(QVar8);
    QTextStream::operator<<(&pSVar1->ts,&local_48);
    if (&(local_48.d.d)->super_QArrayData != (QArrayData *)0x0) {
      LOCK();
      ((local_48.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
           ((local_48.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
      UNLOCK();
      if (((local_48.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
        QArrayData::deallocate(&(local_48.d.d)->super_QArrayData,2,0x10);
      }
    }
    if (d->stream->space == true) {
      QTextStream::operator<<(&d->stream->ts,' ');
    }
    local_88._0_8_ = d->stream;
    ((Stream *)local_88._0_8_)->ref = ((Stream *)local_88._0_8_)->ref + 1;
    operator<<((QDebug *)(local_88 + 8),(Attribute *)local_88);
    QDebug::~QDebug((QDebug *)(local_88 + 8));
    QDebug::~QDebug((QDebug *)local_88);
    if (lVar2 != 1) {
      lVar2 = lVar2 * 0x30 + -0x30;
      do {
        QTextStream::operator<<(&d->stream->ts,',');
        if (d->stream->space == true) {
          QTextStream::operator<<(&d->stream->ts,' ');
        }
        local_98._0_8_ = d->stream;
        ((Stream *)local_98._0_8_)->ref = ((Stream *)local_98._0_8_)->ref + 1;
        operator<<((QDebug *)(local_98 + 8),(Attribute *)local_98);
        QDebug::~QDebug((QDebug *)(local_98 + 8));
        QDebug::~QDebug((QDebug *)local_98);
        lVar2 = lVar2 + -0x30;
      } while (lVar2 != 0);
    }
    QTextStream::operator<<(&d->stream->ts,'}');
    if (d->stream->space == true) {
      QTextStream::operator<<(&d->stream->ts,' ');
    }
  }
  QTextStream::operator<<(&d->stream->ts,')');
  if (d->stream->space == true) {
    QTextStream::operator<<(&d->stream->ts,' ');
  }
  QArrayDataPointer<QInputMethodEvent::Attribute>::~QArrayDataPointer
            ((QArrayDataPointer<QInputMethodEvent::Attribute> *)&local_78);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_30) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

static inline void formatInputMethodEvent(QDebug d, const QInputMethodEvent *e)
{
    d << "QInputMethodEvent(";
    if (!e->preeditString().isEmpty()) {
        d << "preedit=";
        formatUnicodeString(d, e->preeditString());
    }
    if (!e->commitString().isEmpty()) {
        d << ", commit=";
        formatUnicodeString(d, e->commitString());
    }
    if (e->replacementLength()) {
        d << ", replacementStart=" << e->replacementStart() << ", replacementLength="
          << e->replacementLength();
    }
    const auto attributes = e->attributes();
    auto it = attributes.cbegin();
    const auto end = attributes.cend();
    if (it != end) {
        d << ", attributes= {";
        d << *it;
        ++it;
        for (; it != end; ++it)
            d << ',' << *it;
        d << '}';
    }
    d << ')';
}